

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsGetIteratorPrototype(JsValueRef *result)

{
  ScriptContext *pSVar1;
  DynamicObject *pDVar2;
  code *pcVar3;
  bool bVar4;
  JsErrorCode JVar5;
  JsrtContext *currentContext;
  undefined4 *puVar6;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar5 = CheckContext(currentContext,false,true);
  if (JVar5 == JsNoError) {
    pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
             ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (result == (JsValueRef *)0x0) {
      JVar5 = JsErrorNullArgument;
    }
    else {
      pDVar2 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               iteratorPrototype.ptr;
      *result = pDVar2;
      JVar5 = JsNoError;
      if (pDVar2 == (DynamicObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        JVar5 = JsErrorFatal;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  }
  return JVar5;
}

Assistant:

CHAKRA_API
JsGetIteratorPrototype(_Out_ JsValueRef * result)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(result);

        *result = scriptContext->GetLibrary()->GetIteratorPrototype();
        if (*result == JS_INVALID_REFERENCE)
        {
            return JsErrorFatal;
        }

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}